

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O1

void ncnn::copy_make_border_image<float>(Mat *src,Mat *dst,int top,int left,int type,float v)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  undefined4 *puVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  long lVar20;
  
  auVar26 = _DAT_0016f2d0;
  auVar25 = _DAT_0016ed80;
  auVar22 = _DAT_0016ed70;
  auVar18 = _DAT_0016ebc0;
  uVar1 = dst->w;
  lVar12 = (long)(int)uVar1;
  iVar2 = dst->h;
  puVar14 = (undefined4 *)src->data;
  pvVar9 = dst->data;
  if (type == 0) {
    if (top < 1) {
      iVar10 = 0;
    }
    else {
      lVar5 = (ulong)uVar1 - 1;
      auVar27._8_4_ = (int)lVar5;
      auVar27._0_8_ = lVar5;
      auVar27._12_4_ = (int)((ulong)lVar5 >> 0x20);
      iVar11 = 0;
      auVar27 = auVar27 ^ _DAT_0016ebc0;
      do {
        if (0 < (int)uVar1) {
          lVar5 = 0;
          auVar17 = auVar25;
          auVar21 = auVar22;
          do {
            auVar24 = auVar17 ^ auVar18;
            iVar10 = auVar27._4_4_;
            if ((bool)(~(auVar24._4_4_ == iVar10 && auVar27._0_4_ < auVar24._0_4_ ||
                        iVar10 < auVar24._4_4_) & 1)) {
              *(float *)((long)pvVar9 + lVar5) = v;
            }
            if ((auVar24._12_4_ != auVar27._12_4_ || auVar24._8_4_ <= auVar27._8_4_) &&
                auVar24._12_4_ <= auVar27._12_4_) {
              *(float *)((long)pvVar9 + lVar5 + 4) = v;
            }
            auVar24 = auVar21 ^ auVar18;
            iVar15 = auVar24._4_4_;
            if (iVar15 <= iVar10 && (iVar15 != iVar10 || auVar24._0_4_ <= auVar27._0_4_)) {
              *(float *)((long)pvVar9 + lVar5 + 8) = v;
              *(float *)((long)pvVar9 + lVar5 + 0xc) = v;
            }
            lVar6 = auVar26._0_8_;
            lVar20 = auVar17._8_8_;
            auVar17._0_8_ = auVar17._0_8_ + lVar6;
            lVar7 = auVar26._8_8_;
            auVar17._8_8_ = lVar20 + lVar7;
            lVar20 = auVar21._8_8_;
            auVar21._0_8_ = auVar21._0_8_ + lVar6;
            auVar21._8_8_ = lVar20 + lVar7;
            lVar5 = lVar5 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar5);
        }
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        iVar11 = iVar11 + 1;
        iVar10 = top;
      } while (iVar11 != top);
    }
    if (iVar10 < src->h + top) {
      lVar5 = (long)pvVar9 + 0xc;
      auVar18 = _DAT_0016ed70;
      auVar22 = _DAT_0016ed80;
      auVar25 = _DAT_0016ebc0;
      do {
        uVar8 = 0;
        if (0 < left) {
          uVar8 = 0;
          do {
            *(float *)((long)pvVar9 + uVar8 * 4) = v;
            uVar8 = uVar8 + 1;
          } while ((uint)left != uVar8);
        }
        iVar11 = src->w;
        if ((long)iVar11 < 0xc) {
          if ((int)uVar8 < iVar11 + left) {
            uVar8 = uVar8 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar8 * 4) = puVar14[uVar8 - (long)left];
              uVar8 = uVar8 + 1;
            } while ((uint)(iVar11 + left) != uVar8);
          }
        }
        else {
          memcpy((void *)((long)left * 4 + (long)pvVar9),puVar14,(long)iVar11 << 2);
          uVar8 = (ulong)(uint)((int)uVar8 + src->w);
          auVar18 = _DAT_0016ed70;
          auVar22 = _DAT_0016ed80;
          auVar25 = _DAT_0016ebc0;
        }
        iVar11 = (int)uVar8;
        if (iVar11 < (int)uVar1) {
          lVar7 = lVar12 - iVar11;
          lVar6 = lVar7 + -1;
          auVar26._8_4_ = (int)lVar6;
          auVar26._0_8_ = lVar6;
          auVar26._12_4_ = (int)((ulong)lVar6 >> 0x20);
          lVar6 = lVar5 + (long)iVar11 * 4;
          uVar8 = 0;
          do {
            auVar24._8_4_ = (int)uVar8;
            auVar24._0_8_ = uVar8;
            auVar24._12_4_ = (int)(uVar8 >> 0x20);
            auVar27 = (auVar24 | auVar22) ^ auVar25;
            iVar15 = SUB164(auVar26 ^ auVar25,0);
            bVar3 = iVar15 < auVar27._0_4_;
            iVar11 = auVar27._4_4_;
            iVar16 = SUB164(auVar26 ^ auVar25,4);
            if ((bool)(~(iVar16 < iVar11 || iVar11 == iVar16 && bVar3) & 1)) {
              *(float *)(lVar6 + -0xc + uVar8 * 4) = v;
            }
            if (iVar16 >= iVar11 && (iVar11 != iVar16 || !bVar3)) {
              *(float *)(lVar6 + -8 + uVar8 * 4) = v;
            }
            auVar27 = (auVar24 | auVar18) ^ auVar25;
            iVar11 = auVar27._4_4_;
            if (iVar11 <= iVar16 && (iVar11 != iVar16 || auVar27._0_4_ <= iVar15)) {
              *(float *)(lVar6 + -4 + uVar8 * 4) = v;
              *(float *)(lVar6 + uVar8 * 4) = v;
            }
            uVar8 = uVar8 + 4;
          } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar8);
        }
        puVar14 = puVar14 + src->w;
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        iVar10 = iVar10 + 1;
        lVar5 = lVar5 + lVar12 * 4;
      } while (iVar10 < src->h + top);
    }
    auVar25 = _DAT_0016ed80;
    auVar22 = _DAT_0016ed70;
    auVar18 = _DAT_0016ebc0;
    if (iVar10 < iVar2) {
      lVar5 = (ulong)uVar1 - 1;
      auVar28._8_4_ = (int)lVar5;
      auVar28._0_8_ = lVar5;
      auVar28._12_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar28 = auVar28 ^ _DAT_0016ebc0;
      do {
        if (0 < (int)uVar1) {
          lVar5 = 0;
          auVar19 = auVar25;
          auVar23 = auVar22;
          do {
            auVar26 = auVar19 ^ auVar18;
            iVar11 = auVar28._4_4_;
            if ((bool)(~(auVar26._4_4_ == iVar11 && auVar28._0_4_ < auVar26._0_4_ ||
                        iVar11 < auVar26._4_4_) & 1)) {
              *(float *)((long)pvVar9 + lVar5) = v;
            }
            if ((auVar26._12_4_ != auVar28._12_4_ || auVar26._8_4_ <= auVar28._8_4_) &&
                auVar26._12_4_ <= auVar28._12_4_) {
              *(float *)((long)pvVar9 + lVar5 + 4) = v;
            }
            auVar26 = auVar23 ^ auVar18;
            iVar15 = auVar26._4_4_;
            if (iVar15 <= iVar11 && (iVar15 != iVar11 || auVar26._0_4_ <= auVar28._0_4_)) {
              *(float *)((long)pvVar9 + lVar5 + 8) = v;
              *(float *)((long)pvVar9 + lVar5 + 0xc) = v;
            }
            lVar6 = auVar19._8_8_;
            auVar19._0_8_ = auVar19._0_8_ + 4;
            auVar19._8_8_ = lVar6 + 4;
            lVar6 = auVar23._8_8_;
            auVar23._0_8_ = auVar23._0_8_ + 4;
            auVar23._8_8_ = lVar6 + 4;
            lVar5 = lVar5 + 0x10;
          } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar5);
        }
        iVar10 = iVar10 + 1;
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
      } while (iVar10 != iVar2);
    }
  }
  else if (type == 2) {
    puVar14 = puVar14 + (long)src->w * (long)top;
    if (top < 1) {
      iVar10 = 0;
    }
    else {
      lVar5 = (long)left;
      iVar11 = 0;
      do {
        uVar8 = 0;
        if (0 < left) {
          puVar4 = puVar14 + lVar5;
          uVar8 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + uVar8 * 4) = *puVar4;
            uVar8 = uVar8 + 1;
            puVar4 = puVar4 + -1;
          } while ((uint)left != uVar8);
        }
        iVar10 = src->w;
        if ((long)iVar10 < 0xc) {
          if ((int)uVar8 < iVar10 + left) {
            uVar8 = uVar8 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar8 * 4) = puVar14[uVar8 - lVar5];
              uVar8 = uVar8 + 1;
            } while ((uint)(iVar10 + left) != uVar8);
          }
        }
        else {
          memcpy((void *)(lVar5 * 4 + (long)pvVar9),puVar14,(long)iVar10 << 2);
          uVar8 = (ulong)(uint)((int)uVar8 + src->w);
        }
        iVar10 = (int)uVar8;
        if (iVar10 < (int)uVar1) {
          lVar6 = (long)iVar10;
          iVar10 = (left + -2 + src->w * 2) - iVar10;
          do {
            *(undefined4 *)((long)pvVar9 + lVar6 * 4) = puVar14[iVar10];
            lVar6 = lVar6 + 1;
            iVar10 = iVar10 + -1;
          } while (lVar12 != lVar6);
        }
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        puVar14 = puVar14 + -(long)src->w;
        iVar11 = iVar11 + 1;
        iVar10 = top;
      } while (iVar11 != top);
    }
    if (iVar10 < src->h + top) {
      lVar5 = (long)left;
      do {
        uVar8 = 0;
        if (0 < left) {
          puVar4 = puVar14 + lVar5;
          uVar8 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + uVar8 * 4) = *puVar4;
            uVar8 = uVar8 + 1;
            puVar4 = puVar4 + -1;
          } while ((uint)left != uVar8);
        }
        iVar11 = src->w;
        if ((long)iVar11 < 0xc) {
          if ((int)uVar8 < iVar11 + left) {
            uVar8 = uVar8 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar8 * 4) = puVar14[uVar8 - lVar5];
              uVar8 = uVar8 + 1;
            } while ((uint)(iVar11 + left) != uVar8);
          }
        }
        else {
          memcpy((void *)(lVar5 * 4 + (long)pvVar9),puVar14,(long)iVar11 << 2);
          uVar8 = (ulong)(uint)((int)uVar8 + src->w);
        }
        iVar11 = (int)uVar8;
        if (iVar11 < (int)uVar1) {
          lVar6 = (long)iVar11;
          iVar11 = (left + -2 + src->w * 2) - iVar11;
          do {
            *(undefined4 *)((long)pvVar9 + lVar6 * 4) = puVar14[iVar11];
            lVar6 = lVar6 + 1;
            iVar11 = iVar11 + -1;
          } while (lVar12 != lVar6);
        }
        puVar14 = puVar14 + src->w;
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        iVar10 = iVar10 + 1;
      } while (iVar10 < src->h + top);
    }
    if (iVar10 < iVar2) {
      puVar14 = puVar14 + (long)src->w * -2;
      lVar5 = (long)left;
      do {
        uVar8 = 0;
        if (0 < left) {
          puVar4 = puVar14 + lVar5;
          uVar8 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + uVar8 * 4) = *puVar4;
            uVar8 = uVar8 + 1;
            puVar4 = puVar4 + -1;
          } while ((uint)left != uVar8);
        }
        iVar11 = src->w;
        if ((long)iVar11 < 0xc) {
          if ((int)uVar8 < iVar11 + left) {
            uVar8 = uVar8 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar8 * 4) = puVar14[uVar8 - lVar5];
              uVar8 = uVar8 + 1;
            } while ((uint)(iVar11 + left) != uVar8);
          }
        }
        else {
          memcpy((void *)(lVar5 * 4 + (long)pvVar9),puVar14,(long)iVar11 << 2);
          uVar8 = (ulong)(uint)((int)uVar8 + src->w);
        }
        iVar11 = (int)uVar8;
        if (iVar11 < (int)uVar1) {
          lVar6 = (long)iVar11;
          iVar11 = (left + -2 + src->w * 2) - iVar11;
          do {
            *(undefined4 *)((long)pvVar9 + lVar6 * 4) = puVar14[iVar11];
            lVar6 = lVar6 + 1;
            iVar11 = iVar11 + -1;
          } while (lVar12 != lVar6);
        }
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        puVar14 = puVar14 + -(long)src->w;
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar2);
    }
  }
  else if (type == 1) {
    lVar5 = (long)left;
    uVar8 = (ulong)(uint)left;
    if (top < 1) {
      iVar10 = 0;
    }
    else {
      iVar11 = 0;
      do {
        uVar13 = 0;
        if (0 < left) {
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + uVar13 * 4) = *puVar14;
            uVar13 = uVar13 + 1;
          } while (uVar8 != uVar13);
        }
        iVar10 = src->w;
        if ((long)iVar10 < 0xc) {
          if ((int)uVar13 < iVar10 + left) {
            uVar13 = uVar13 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar13 * 4) = puVar14[uVar13 - lVar5];
              uVar13 = uVar13 + 1;
            } while ((uint)(iVar10 + left) != uVar13);
          }
        }
        else {
          memcpy((void *)(lVar5 * 4 + (long)pvVar9),puVar14,(long)iVar10 << 2);
          uVar13 = (ulong)(uint)((int)uVar13 + src->w);
        }
        if ((int)uVar13 < (int)uVar1) {
          iVar10 = src->w;
          lVar6 = (long)(int)uVar13;
          do {
            *(undefined4 *)((long)pvVar9 + lVar6 * 4) = puVar14[(long)iVar10 + -1];
            lVar6 = lVar6 + 1;
          } while (lVar12 != lVar6);
        }
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        iVar11 = iVar11 + 1;
        iVar10 = top;
      } while (iVar11 != top);
    }
    if (iVar10 < src->h + top) {
      do {
        uVar13 = 0;
        if (0 < left) {
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + uVar13 * 4) = *puVar14;
            uVar13 = uVar13 + 1;
          } while (uVar8 != uVar13);
        }
        iVar11 = src->w;
        if ((long)iVar11 < 0xc) {
          if ((int)uVar13 < iVar11 + left) {
            uVar13 = uVar13 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar13 * 4) = puVar14[uVar13 - lVar5];
              uVar13 = uVar13 + 1;
            } while ((uint)(iVar11 + left) != uVar13);
          }
        }
        else {
          memcpy((void *)(lVar5 * 4 + (long)pvVar9),puVar14,(long)iVar11 << 2);
          uVar13 = (ulong)(uint)((int)uVar13 + src->w);
        }
        if ((int)uVar13 < (int)uVar1) {
          iVar11 = src->w;
          lVar6 = (long)(int)uVar13;
          do {
            *(undefined4 *)((long)pvVar9 + lVar6 * 4) = puVar14[(long)iVar11 + -1];
            lVar6 = lVar6 + 1;
          } while (lVar12 != lVar6);
        }
        puVar14 = puVar14 + src->w;
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        iVar10 = iVar10 + 1;
      } while (iVar10 < src->h + top);
    }
    if (iVar10 < iVar2) {
      iVar11 = src->w;
      puVar4 = puVar14 + -(long)iVar11;
      do {
        uVar13 = 0;
        if (0 < left) {
          uVar13 = 0;
          do {
            *(undefined4 *)((long)pvVar9 + uVar13 * 4) = *puVar4;
            uVar13 = uVar13 + 1;
          } while (uVar8 != uVar13);
        }
        iVar15 = src->w;
        if ((long)iVar15 < 0xc) {
          if ((int)uVar13 < iVar15 + left) {
            uVar13 = uVar13 & 0xffffffff;
            do {
              *(undefined4 *)((long)pvVar9 + uVar13 * 4) =
                   *(undefined4 *)((long)puVar14 + (uVar13 * 4 - (lVar5 * 4 + (long)iVar11 * 4)));
              uVar13 = uVar13 + 1;
            } while ((uint)(iVar15 + left) != uVar13);
          }
        }
        else {
          memcpy((void *)(lVar5 * 4 + (long)pvVar9),puVar4,(long)iVar15 << 2);
          uVar13 = (ulong)(uint)((int)uVar13 + src->w);
        }
        if ((int)uVar13 < (int)uVar1) {
          iVar15 = src->w;
          lVar6 = (long)(int)uVar13;
          do {
            *(undefined4 *)((long)pvVar9 + lVar6 * 4) = puVar4[(long)iVar15 + -1];
            lVar6 = lVar6 + 1;
          } while (lVar12 != lVar6);
        }
        pvVar9 = (void *)((long)pvVar9 + lVar12 * 4);
        iVar10 = iVar10 + 1;
      } while (iVar10 != iVar2);
    }
  }
  return;
}

Assistant:

static void copy_make_border_image(const Mat& src, Mat& dst, int top, int left, int type, T v)
{
    int w = dst.w;
    int h = dst.h;

    const T* ptr = src;
    T* outptr = dst;

    if (type == 0)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = v;
            }
            if (src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < w; x++)
            {
                outptr[x] = v;
            }
            outptr += w;
        }
    }
    else if (type == 1)
    {
        int y = 0;
        // fill top
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[0];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - 1];
            }
            outptr += w;
        }
    }
    else if (type == 2)
    {
        int y = 0;
        // fill top
        ptr += top * src.w;
        for (; y < top; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
        // fill center
        for (; y < (top + src.h); y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            ptr += src.w;
            outptr += w;
        }
        // fill bottom
        ptr -= 2 * src.w;
        for (; y < h; y++)
        {
            int x = 0;
            for (; x < left; x++)
            {
                outptr[x] = ptr[left - x];
            }
            if(src.w < 12)
            {
                for (; x < (left + src.w); x++)
                {
                    outptr[x] = ptr[x - left];
                }
            }
            else
            {
                memcpy(outptr + left, ptr, src.w * sizeof(T));
                x += src.w;
            }
            for (; x < w; x++)
            {
                outptr[x] = ptr[src.w - (x - left - src.w) - 2];
            }
            outptr += w;
            ptr -= src.w;
        }
    }

}